

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall Js::RecyclableObjectAddress::Set(RecyclableObjectAddress *this,Var updateObject)

{
  bool bVar1;
  RecyclableObject *this_00;
  ScriptContext *requestContext_00;
  ScriptContext *requestContext;
  RecyclableObject *obj;
  Var updateObject_local;
  RecyclableObjectAddress *this_local;
  
  bVar1 = VarIs<Js::RecyclableObject>(this->parentObj);
  if (bVar1) {
    this_00 = VarTo<Js::RecyclableObject>(this->parentObj);
    requestContext_00 = RecyclableObject::GetScriptContext(this_00);
    this_local._4_4_ =
         Js::JavascriptOperators::SetProperty
                   (this_00,this_00,this->propId,updateObject,requestContext_00,
                    PropertyOperation_None);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL RecyclableObjectAddress::Set(Var updateObject)
    {
        if (Js::VarIs<Js::RecyclableObject>(parentObj))
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(parentObj);

            ScriptContext* requestContext = obj->GetScriptContext(); //TODO: real requestContext
            return Js::JavascriptOperators::SetProperty(obj, obj, propId, updateObject, requestContext);
        }
        return FALSE;
    }